

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O3

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::Grow(TemporaryBuffer *this)

{
  OLECHAR *src;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  OLECHAR *dst;
  ulong __size;
  uint uVar4;
  
  if (this->m_pscanner == (Scanner<UTF8EncodingPolicyBase<false>_> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.h"
                       ,0x2ab,"(m_pscanner != nullptr)","m_pscanner != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->m_cchMax < 0x40000000) {
    src = this->m_prgch;
    uVar4 = this->m_cchMax << 2;
    __size = (ulong)uVar4;
    if (src == (OLECHAR *)this->m_rgbInit) {
      dst = (OLECHAR *)malloc(__size);
      if (dst != (OLECHAR *)0x0) {
        js_memcpy_s(dst,__size,src,(ulong)this->m_ichCur * 2);
        goto LAB_00f01ee0;
      }
    }
    else {
      dst = (OLECHAR *)realloc(src,__size);
      if (dst != (OLECHAR *)0x0) {
LAB_00f01ee0:
        this->m_prgch = dst;
        this->m_cchMax = uVar4 >> 1;
        return;
      }
    }
  }
  Error(this->m_pscanner,-0x7ff5fc17);
}

Assistant:

void Grow()
        {
            Assert(m_pscanner != nullptr);
            byte *prgbNew;
            byte *prgbOld = (byte *)m_prgch;

            ULONG cbNew;
            if (FAILED(ULongMult(m_cchMax, sizeof(OLECHAR) * 2, &cbNew)))
            {
                m_pscanner->Error(ERRnoMemory);
            }

            if (prgbOld == m_rgbInit)
            {
                if (nullptr == (prgbNew = static_cast<byte*>(malloc(cbNew))))
                    m_pscanner->Error(ERRnoMemory);
                js_memcpy_s(prgbNew, cbNew, prgbOld, m_ichCur * sizeof(OLECHAR));
            }
            else if (nullptr == (prgbNew = static_cast<byte*>(realloc(prgbOld, cbNew))))
            {
                m_pscanner->Error(ERRnoMemory);
            }

            m_prgch = (OLECHAR*)prgbNew;
            m_cchMax = cbNew / sizeof(OLECHAR);
        }